

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

void __thiscall
cnn::KMaxPooling::forward_impl
          (KMaxPooling *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float fVar1;
  uint uVar2;
  Index IVar3;
  Scalar *pSVar4;
  uint uVar5;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Dim *in_RDI;
  float xij;
  uint j_1;
  uint tt;
  float c;
  uint j;
  uint i;
  int *maxmap;
  uint xcols;
  uint rows;
  uint mi;
  float tmp [1024];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  uint local_1084;
  uint in_stack_ffffffffffffef80;
  Scalar in_stack_ffffffffffffef84;
  uint uVar6;
  uint uVar7;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *this_00;
  undefined4 in_stack_ffffffffffffef98;
  undefined4 in_stack_ffffffffffffef9c;
  uint uVar8;
  uint uVar9;
  Scalar local_1058 [1046];
  
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
  Tensor::operator*((Tensor *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  Tensor::operator*((Tensor *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  IVar3 = Eigen::
          MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
          cols((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)0x52861f);
  if (0x3ff < IVar3) {
    __assert_fail("x.cols() < 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                  ,0x122,
                  "virtual void cnn::KMaxPooling::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  uVar8 = 0;
  IVar3 = Eigen::
          MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
          rows((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)in_RDI);
  uVar2 = (uint)IVar3;
  IVar3 = Eigen::
          MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
          cols((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)0x52866e);
  uVar5 = (uint)IVar3;
  this_00 = *(DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              **)in_RDI[2].d;
  uVar7 = 0;
  do {
    if (uVar2 <= uVar7) {
      uVar2 = Dim::size(in_RDI);
      if (uVar8 != uVar2) {
        __assert_fail("mi == dim.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                      ,0x13b,
                      "virtual void cnn::KMaxPooling::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                     );
      }
      return;
    }
    for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
      pSVar4 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()(this_00,CONCAT44(uVar7,uVar6),
                            CONCAT44(in_stack_ffffffffffffef84,in_stack_ffffffffffffef80));
      local_1058[uVar6] = -*pSVar4;
    }
    std::nth_element<float*>
              ((float *)CONCAT44(uVar8,uVar2),(float *)CONCAT44(uVar5,in_stack_ffffffffffffef98),
               (float *)this_00);
    in_stack_ffffffffffffef84 = -local_1058[in_RDI[2].d[2] - 1];
    in_stack_ffffffffffffef80 = 0;
    uVar9 = uVar8;
    for (local_1084 = 0; uVar8 = uVar9, local_1084 < uVar5; local_1084 = local_1084 + 1) {
      pSVar4 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()(this_00,CONCAT44(uVar7,uVar6),
                            CONCAT44(in_stack_ffffffffffffef84,in_stack_ffffffffffffef80));
      fVar1 = *pSVar4;
      uVar8 = uVar9;
      if (in_stack_ffffffffffffef84 <= fVar1) {
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()(this_00,CONCAT44(uVar7,uVar6),
                              CONCAT44(in_stack_ffffffffffffef84,in_stack_ffffffffffffef80));
        *pSVar4 = fVar1;
        uVar8 = uVar9 + 1;
        *(uint *)(this_00 + (ulong)uVar9 * 4) = local_1084;
        in_stack_ffffffffffffef80 = in_stack_ffffffffffffef80 + 1;
        if (in_stack_ffffffffffffef80 == in_RDI[2].d[2]) break;
      }
      uVar9 = uVar8;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void KMaxPooling::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("KMaxPooling::forward not implemented for CUDA");
#else
  auto x=**xs[0];
  auto y=*fx;
  float tmp[1024];
  assert(x.cols() < 1024);
  unsigned mi = 0;
  const unsigned rows = x.rows();
  const unsigned xcols = x.cols();
  int* maxmap = static_cast<int*>(aux_mem);
  for (unsigned i=0; i < rows; ++i) {
    //cerr << "row(" << i << ")=" << x.row(i) << endl;
    for (unsigned j=0; j < xcols; ++j)
      tmp[j] = -x(i,j);
    nth_element(tmp, tmp + (k-1), tmp + xcols);
    const float c = -tmp[k-1];  // kth largest element in row i
    unsigned tt = 0;
    for (unsigned j = 0; j < xcols; ++j) {
      const float xij = x(i,j);
      if (xij >= c) {
        //cerr << xij << ' ';
        y(i,tt) = xij;
        //assert(mi < dim.size());
        maxmap[mi++] = j;
        ++tt;
        if (tt == k) break;  // could happen in case of ties
      }
    }
    //cerr << endl; abort();
  }
  assert(mi == dim.size());
#endif
}